

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JacobiSVD.h
# Opt level: O1

JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> * __thiscall
Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::compute
          (JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *this,MatrixType *matrix,
          uint computationOptions)

{
  SingularValuesType *pSVar1;
  undefined4 uVar2;
  long lVar3;
  PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pPVar4;
  DenseStorage<float,_9,_3,_3,_0> *pDVar5;
  Index i;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  float *pfVar9;
  JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *pJVar10;
  long lVar11;
  float *pfVar12;
  ulong uVar13;
  bool *pbVar14;
  float *pfVar15;
  JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *pJVar16;
  undefined1 *puVar17;
  bool bVar18;
  uint uVar19;
  uint uVar20;
  float fVar21;
  Scalar SVar22;
  float fVar26;
  float fVar27;
  Packet4f res;
  float fVar28;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float s;
  undefined1 auVar29 [16];
  float s_1;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ActualDstType actualDst;
  JacobiRotation<float> j_right;
  Scalar elements [4];
  JacobiRotation<float> local_c8;
  float *local_c0;
  JacobiRotation<float> local_b8;
  undefined8 uStack_b0;
  SingularValuesType *local_a0;
  ulong local_98;
  undefined8 local_88;
  float *local_80;
  undefined1 *local_78;
  float *local_70;
  float *local_68;
  float *local_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  allocate(this,3,3,computationOptions);
  fVar21 = ABS((matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[0]);
  fVar26 = ABS((matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[1]);
  fVar27 = ABS((matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[2]);
  fVar28 = ABS((matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[3]);
  auVar31._0_8_ =
       *(ulong *)((matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array + 4) & 0x7fffffff7fffffff;
  auVar31._8_4_ =
       ABS((matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[6]);
  auVar31._12_4_ =
       ABS((matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[7]);
  uVar19 = -(uint)NAN(fVar21);
  uVar20 = -(uint)NAN(fVar26);
  auVar30._8_4_ = fVar27;
  auVar30._0_8_ =
       *(ulong *)(matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array & 0x7fffffff7fffffff;
  auVar30._12_4_ = fVar28;
  auVar31 = maxps(auVar30,auVar31);
  local_b8.m_s = (float)(~uVar20 & auVar31._4_4_ | (uint)fVar26 & uVar20);
  local_b8.m_c = (float)(~uVar19 & auVar31._0_4_ | (uint)fVar21 & uVar19);
  uStack_b0 = CONCAT44(~-(uint)NAN(fVar28) & auVar31._12_4_ | (uint)fVar28 & -(uint)NAN(fVar28),
                       ~-(uint)NAN(fVar27) & auVar31._8_4_ | (uint)fVar27 & -(uint)NAN(fVar27));
  uVar13 = 2;
  do {
    uVar8 = 0;
    do {
      fVar21 = (&local_b8.m_c)[uVar8];
      fVar26 = (&local_b8.m_c)[uVar13 + uVar8];
      fVar27 = fVar26;
      if (fVar26 <= fVar21) {
        fVar27 = fVar21;
      }
      (&local_b8.m_c)[uVar8] =
           (float)(-(uint)NAN(fVar21) & (uint)fVar21 |
                  ~-(uint)NAN(fVar21) &
                  (~-(uint)NAN(fVar26) & (uint)fVar27 | -(uint)NAN(fVar26) & (uint)fVar26));
      uVar8 = uVar8 + 1;
    } while (uVar13 != uVar8);
    bVar18 = 1 < uVar13;
    uVar13 = uVar13 >> 1;
  } while (bVar18);
  fVar21 = (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[8];
  fVar26 = ABS(fVar21);
  uVar19 = -(uint)NAN(fVar21);
  fVar21 = fVar26;
  if (fVar26 <= local_b8.m_c) {
    fVar21 = local_b8.m_c;
  }
  fVar21 = (float)(-(uint)NAN(local_b8.m_c) & (uint)local_b8.m_c |
                  ~-(uint)NAN(local_b8.m_c) & (~uVar19 & (uint)fVar21 | uVar19 & (uint)fVar26));
  if ((uint)ABS(fVar21) < 0x7f800000) {
    fVar21 = (float)(~-(uint)(fVar21 == 0.0) & (uint)fVar21 | -(uint)(fVar21 == 0.0) & 0x3f800000);
    lVar6 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_rows;
    lVar11 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_cols
    ;
    if (lVar6 == lVar11) {
      lVar3 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_diagSize;
      if (lVar3 < 0) {
        pcVar7 = 
        "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<float, 3, 3>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<float, 3, 3>>, Level = 0]"
        ;
LAB_00170648:
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                      ,0xb2,pcVar7);
      }
      if (3 < lVar3) {
        pcVar7 = 
        "Eigen::Block<const Eigen::Matrix<float, 3, 3>>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<float, 3, 3>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
        ;
LAB_00170629:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                      ,0x93,pcVar7);
      }
      if (lVar3 != 3) {
LAB_00170652:
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                      ,0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<float, 3, 3>>::resize(Index, Index) [Derived = Eigen::Matrix<float, 3, 3>]"
                     );
      }
      *(float *)&(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 field_0x8c =
           (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0] / fVar21;
      *(float *)&this->field_0x90 =
           (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[1] / fVar21;
      *(float *)&this->field_0x94 =
           (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[2] / fVar21;
      *(float *)&this->field_0x98 =
           (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[3] / fVar21;
      *(float *)&this->field_0x9c =
           (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[4] / fVar21;
      *(float *)&this->field_0xa0 =
           (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[5] / fVar21;
      *(float *)&this->field_0xa4 =
           (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[6] / fVar21;
      *(float *)&this->field_0xa8 =
           (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[7] / fVar21;
      *(float *)&this->field_0xac =
           (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[8] / fVar21;
      if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
          m_computeFullU == true) {
        if (lVar6 != 3) goto LAB_00170652;
        pPVar4 = &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>;
        (pPVar4->m_storage).m_data.array[0] = 1.0;
        (pPVar4->m_storage).m_data.array[1] = 0.0;
        pDVar5 = &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage;
        (pDVar5->m_data).array[2] = 0.0;
        (pDVar5->m_data).array[3] = 0.0;
        pDVar5 = &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage;
        (pDVar5->m_data).array[4] = 1.0;
        (pDVar5->m_data).array[5] = 0.0;
        pDVar5 = &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage;
        (pDVar5->m_data).array[6] = 0.0;
        (pDVar5->m_data).array[7] = 0.0;
        (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
        super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
      }
      if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
          m_computeThinU == true) {
        if (lVar6 != 3) goto LAB_00170652;
        auVar23._0_12_ = ZEXT812(0x3f800000);
        auVar23._12_4_ = 0;
        *(undefined1 (*) [16])
         (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array =
             auVar23;
        *(undefined1 (*) [16])
         ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU
          .super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 4) =
             auVar23;
        (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
        super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
      }
      if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
          m_computeFullV == true) {
        if (lVar11 != 3) goto LAB_00170652;
        auVar24._0_12_ = ZEXT812(0x3f800000);
        auVar24._12_4_ = 0;
        *(undefined1 (*) [16])
         (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array =
             auVar24;
        *(undefined1 (*) [16])
         ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV
          .super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 4) =
             auVar24;
        (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
        super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
      }
      if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
          m_computeThinV == true) {
        if (lVar11 != 3) goto LAB_00170652;
        auVar25._0_12_ = ZEXT812(0x3f800000);
        auVar25._12_4_ = 0;
        *(undefined1 (*) [16])
         (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array =
             auVar25;
        *(undefined1 (*) [16])
         ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV
          .super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 4) =
             auVar25;
        (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
        super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
      }
    }
    else {
      auVar29._4_4_ = fVar21;
      auVar29._0_4_ = fVar21;
      auVar29._8_4_ = fVar21;
      auVar29._12_4_ = fVar21;
      auVar31 = divps(*(undefined1 (*) [16])
                       (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array,auVar29);
      *(undefined1 (*) [16])
       (this->m_scaledMatrix).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
       m_data.array = auVar31;
      auVar31 = divps(*(undefined1 (*) [16])
                       ((matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array + 4),auVar29);
      *(undefined1 (*) [16])
       ((this->m_scaledMatrix).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
        .m_data.array + 4) = auVar31;
      (this->m_scaledMatrix).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[8] =
           (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[8] / fVar21;
    }
    uStack_50 = 0;
    uStack_4c = 0;
    pfVar12 = (float *)&(this->
                        super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                        field_0x8c;
    fVar27 = ABS(*(float *)&(this->
                            super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                            ).field_0x8c);
    fVar26 = ABS(*(float *)&this->field_0xac);
    if (ABS(*(float *)&this->field_0xac) <= ABS(*(float *)&this->field_0x9c)) {
      fVar26 = ABS(*(float *)&this->field_0x9c);
    }
    if (fVar26 <= fVar27) {
      fVar26 = fVar27;
    }
    local_78 = &this->field_0x90;
    local_80 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
               m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array + 3;
    local_70 = pfVar12;
    local_58 = fVar21;
    uStack_54 = 0;
    do {
      bVar18 = true;
      if (1 < (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_diagSize) {
        uVar13 = 1;
        bVar18 = true;
        pfVar9 = local_80;
        pJVar10 = this;
        puVar17 = local_78;
        do {
          local_c0 = pfVar12 + uVar13 * 3;
          uVar8 = 0;
          pfVar15 = pfVar12;
          pJVar16 = this;
          local_68 = pfVar9;
          do {
            fVar21 = fVar26 * 2.3841858e-07;
            if (fVar21 <= 1.1754944e-38) {
              fVar21 = 1.1754944e-38;
            }
            if ((fVar21 < ABS((pfVar12 + uVar8 * 3)[uVar13])) || (fVar21 < ABS(local_c0[uVar8]))) {
              uStack_44 = 0;
              uStack_40 = 0;
              uStack_3c = 0;
              local_60 = pfVar12 + uVar8 * 3;
              local_48 = fVar26;
              internal::real_2x2_jacobi_svd<Eigen::Matrix<float,3,3,0,3,3>,float,long>
                        ((Matrix<float,_3,_3,_0,_3,_3> *)pfVar12,uVar13,uVar8,&local_b8,&local_c8);
              if ((2 < uVar13) || (2 < uVar8)) {
                pcVar7 = 
                "Eigen::Block<Eigen::Matrix<float, 3, 3>, 1, 3>::Block(XprType &, Index) [XprType = Eigen::Matrix<float, 3, 3>, BlockRows = 1, BlockCols = 3, InnerPanel = false]"
                ;
                goto LAB_001705f3;
              }
              if ((((local_b8.m_c != 1.0) || (NAN(local_b8.m_c))) || (local_b8.m_s != 0.0)) ||
                 (NAN(local_b8.m_s))) {
                lVar6 = 0;
                do {
                  fVar21 = *(float *)(puVar17 + lVar6);
                  fVar26 = *(float *)((long)pfVar15 + lVar6);
                  *(float *)(puVar17 + lVar6) = local_b8.m_c * fVar21 + local_b8.m_s * fVar26;
                  *(float *)((long)pfVar15 + lVar6) = fVar21 * -local_b8.m_s + fVar26 * local_b8.m_c
                  ;
                  lVar6 = lVar6 + 0xc;
                } while (lVar6 != 0x24);
              }
              if ((((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
                    .m_computeFullU != false) ||
                  (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
                    .m_computeThinU & 1U) != 0)) &&
                 (((local_b8.m_c != 1.0 || ((NAN(local_b8.m_c) || (local_b8.m_s != 0.0)))) ||
                  (NAN(local_b8.m_s))))) {
                lVar6 = 0;
                do {
                  fVar21 = local_68[lVar6];
                  fVar26 = (pJVar16->
                           super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
                           .m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[lVar6];
                  local_68[lVar6] = local_b8.m_c * fVar21 + local_b8.m_s * fVar26;
                  (pJVar16->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                  ).m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[lVar6] = fVar21 * -local_b8.m_s + fVar26 * local_b8.m_c;
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 3);
              }
              bVar18 = local_c8.m_c != 1.0 || local_c8.m_s != 0.0;
              if (bVar18) {
                lVar6 = 0x23;
                do {
                  fVar21 = (pJVar10->
                           super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
                           .m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[lVar6 + 3];
                  fVar26 = (pJVar16->
                           super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
                           .m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[lVar6];
                  (pJVar10->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                  ).m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[lVar6 + 3] = local_c8.m_c * fVar21 + fVar26 * -local_c8.m_s;
                  (pJVar16->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                  ).m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[lVar6] = fVar21 * local_c8.m_s + fVar26 * local_c8.m_c;
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 0x26);
              }
              if ((bVar18 & ((this->
                             super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                             ).m_computeThinV |
                            (this->
                            super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                            ).m_computeFullV)) != 0) {
                lVar6 = 9;
                do {
                  fVar21 = (pJVar10->
                           super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
                           .m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[lVar6 + 3];
                  fVar26 = (pJVar16->
                           super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
                           .m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[lVar6];
                  (pJVar10->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                  ).m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[lVar6 + 3] = local_c8.m_c * fVar21 + fVar26 * -local_c8.m_s;
                  (pJVar16->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                  ).m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[lVar6] = fVar21 * local_c8.m_s + fVar26 * local_c8.m_c;
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 0xc);
              }
              fVar26 = ABS(local_60[uVar8]);
              if (ABS(local_60[uVar8]) <= ABS(local_c0[uVar13])) {
                fVar26 = ABS(local_c0[uVar13]);
              }
              if (fVar26 <= local_48) {
                fVar26 = local_48;
              }
              bVar18 = false;
              pfVar9 = local_68;
              pfVar12 = local_70;
            }
            uVar8 = uVar8 + 1;
            pfVar15 = pfVar15 + 1;
            pJVar16 = (JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)
                      ((pJVar16->
                       super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                       m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array + 3);
          } while (uVar8 != uVar13);
          uVar13 = uVar13 + 1;
          puVar17 = puVar17 + 4;
          pfVar9 = pfVar9 + 3;
          pJVar10 = (JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)
                    ((pJVar10->
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                     m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array + 3);
        } while ((long)uVar13 <
                 (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_diagSize);
      }
    } while (!bVar18);
    uVar13 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
             m_diagSize;
    if (0 < (long)uVar13) {
      bVar18 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
               m_computeFullU;
      pfVar9 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
               m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array + 2;
      uVar8 = 0;
      do {
        fVar21 = *pfVar12;
        (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
        m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[uVar8] = ABS(fVar21);
        if ((fVar21 < 0.0) &&
           ((((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_computeThinU | bVar18) & 1U) != 0)) {
          if (2 < uVar8) goto LAB_001705fd;
          fVar21 = pfVar9[-1];
          fVar26 = *pfVar9;
          ((plain_array<float,_9,_0,_0> *)(pfVar9 + -2))->array[0] =
               -((plain_array<float,_9,_0,_0> *)(pfVar9 + -2))->array[0];
          pfVar9[-1] = -fVar21;
          *pfVar9 = -fVar26;
        }
        uVar8 = uVar8 + 1;
        pfVar9 = pfVar9 + 3;
        pfVar12 = pfVar12 + 4;
      } while (uVar13 != uVar8);
    }
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
    m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
               m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0] * local_58;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
    m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
               m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[1] * local_58;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
    m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
               m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2] * local_58;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
    m_nonzeroSingularValues = uVar13;
    lVar6 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
            m_diagSize;
    if (0 < lVar6) {
      pSVar1 = &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                m_singularValues;
      pbVar14 = (bool *)&(this->
                         super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                         m_info;
      pfVar12 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + 2;
      lVar11 = 0;
      uVar13 = 0;
      do {
        local_b8 = (JacobiRotation<float>)((long)pbVar14 + lVar6 * -4);
        uStack_b0 = lVar6 + lVar11;
        if ((long)uStack_b0 < 0) {
          pcVar7 = 
          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<float, 3, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, 3, 1>, -1, 1>, Level = 0]"
          ;
          goto LAB_00170648;
        }
        local_98 = (uVar13 - lVar6) + 3;
        local_88 = 3;
        local_a0 = pSVar1;
        if ((long)(local_98 | uStack_b0) < 0) {
          pcVar7 = 
          "Eigen::Block<Eigen::Matrix<float, 3, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, 3, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
          ;
          goto LAB_00170629;
        }
        SVar22 = DenseBase<Eigen::Block<Eigen::Matrix<float,3,1,0,3,1>,-1,1,false>>::
                 maxCoeff<0,long>((DenseBase<Eigen::Block<Eigen::Matrix<float,3,1,0,3,1>,_1,1,false>>
                                   *)&local_b8,(long *)&local_c8);
        if ((SVar22 != 0.0) || (NAN(SVar22))) {
          if (local_c8 != (JacobiRotation<float>)0x0) {
            local_c8 = (JacobiRotation<float>)((long)local_c8 + uVar13);
            fVar21 = (((SingularValuesType *)(pbVar14 + -0xc))->
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                     array[0];
            (((SingularValuesType *)(pbVar14 + -0xc))->
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
                 (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[(long)local_c8];
            (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
            m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[(long)local_c8] = fVar21;
            if (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_computeFullU != false) ||
               (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_computeThinU & 1U) != 0)) {
              if ((2 < (ulong)local_c8) || (2 < uVar13)) {
LAB_001705fd:
                pcVar7 = 
                "Eigen::Block<Eigen::Matrix<float, 3, 3>, 3, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<float, 3, 3>, BlockRows = 3, BlockCols = 1, InnerPanel = true]"
                ;
LAB_001705f3:
                __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                              ,0x7a,pcVar7);
              }
              fVar21 = (this->
                       super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                       m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[(long)local_c8 * 3];
              (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[(long)local_c8 * 3] = pfVar12[-0xb];
              pfVar12[-0xb] = fVar21;
              uVar2 = (this->
                      super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                      m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[(long)local_c8 * 3U + 1];
              (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[(long)local_c8 * 3U + 1] = pfVar12[-10];
              pfVar12[-10] = (float)uVar2;
              uVar2 = (this->
                      super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                      m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[(long)local_c8 * 3U + 2];
              (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[(long)local_c8 * 3U + 2] = pfVar12[-9];
              pfVar12[-9] = (float)uVar2;
            }
            if (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_computeFullV != false) ||
               (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_computeThinV & 1U) != 0)) {
              if ((2 < (ulong)local_c8) || (2 < uVar13)) goto LAB_001705fd;
              fVar21 = (this->
                       super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                       m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[(long)local_c8 * 3];
              (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[(long)local_c8 * 3] = ((plain_array<float,_9,_0,_0> *)(pfVar12 + -2))->array[0]
              ;
              ((plain_array<float,_9,_0,_0> *)(pfVar12 + -2))->array[0] = fVar21;
              fVar21 = (this->
                       super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                       m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[(long)local_c8 * 3U + 1];
              (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[(long)local_c8 * 3U + 1] = pfVar12[-1];
              pfVar12[-1] = fVar21;
              fVar21 = (this->
                       super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                       m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[(long)local_c8 * 3U + 2];
              (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[(long)local_c8 * 3U + 2] = *pfVar12;
              *pfVar12 = fVar21;
            }
          }
        }
        else {
          (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
          m_nonzeroSingularValues = uVar13;
        }
        if ((SVar22 == 0.0) && (!NAN(SVar22))) break;
        uVar13 = uVar13 + 1;
        lVar6 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                m_diagSize;
        lVar11 = lVar11 + -1;
        pbVar14 = pbVar14 + 4;
        pfVar12 = pfVar12 + 3;
      } while ((long)uVar13 < lVar6);
    }
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_isInitialized
         = true;
  }
  else {
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_isInitialized
         = true;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_info =
         InvalidInput;
  }
  return this;
}

Assistant:

JacobiSVD<MatrixType, QRPreconditioner>&
JacobiSVD<MatrixType, QRPreconditioner>::compute(const MatrixType& matrix, unsigned int computationOptions)
{
  using std::abs;
  allocate(matrix.rows(), matrix.cols(), computationOptions);

  // currently we stop when we reach precision 2*epsilon as the last bit of precision can require an unreasonable number of iterations,
  // only worsening the precision of U and V as we accumulate more rotations
  const RealScalar precision = RealScalar(2) * NumTraits<Scalar>::epsilon();

  // limit for denormal numbers to be considered zero in order to avoid infinite loops (see bug 286)
  const RealScalar considerAsZero = (std::numeric_limits<RealScalar>::min)();

  // Scaling factor to reduce over/under-flows
  RealScalar scale = matrix.cwiseAbs().template maxCoeff<PropagateNaN>();
  if (!(numext::isfinite)(scale)) {
    m_isInitialized = true;
    m_info = InvalidInput;
    return *this;
  }
  if(scale==RealScalar(0)) scale = RealScalar(1);
  
  /*** step 1. The R-SVD step: we use a QR decomposition to reduce to the case of a square matrix */

  if(m_rows!=m_cols)
  {
    m_scaledMatrix = matrix / scale;
    m_qr_precond_morecols.run(*this, m_scaledMatrix);
    m_qr_precond_morerows.run(*this, m_scaledMatrix);
  }
  else
  {
    m_workMatrix = matrix.block(0,0,m_diagSize,m_diagSize) / scale;
    if(m_computeFullU) m_matrixU.setIdentity(m_rows,m_rows);
    if(m_computeThinU) m_matrixU.setIdentity(m_rows,m_diagSize);
    if(m_computeFullV) m_matrixV.setIdentity(m_cols,m_cols);
    if(m_computeThinV) m_matrixV.setIdentity(m_cols, m_diagSize);
  }

  /*** step 2. The main Jacobi SVD iteration. ***/
  RealScalar maxDiagEntry = m_workMatrix.cwiseAbs().diagonal().maxCoeff();

  bool finished = false;
  while(!finished)
  {
    finished = true;

    // do a sweep: for all index pairs (p,q), perform SVD of the corresponding 2x2 sub-matrix

    for(Index p = 1; p < m_diagSize; ++p)
    {
      for(Index q = 0; q < p; ++q)
      {
        // if this 2x2 sub-matrix is not diagonal already...
        // notice that this comparison will evaluate to false if any NaN is involved, ensuring that NaN's don't
        // keep us iterating forever. Similarly, small denormal numbers are considered zero.
        RealScalar threshold = numext::maxi<RealScalar>(considerAsZero, precision * maxDiagEntry);
        if(abs(m_workMatrix.coeff(p,q))>threshold || abs(m_workMatrix.coeff(q,p)) > threshold)
        {
          finished = false;
          // perform SVD decomposition of 2x2 sub-matrix corresponding to indices p,q to make it diagonal
          // the complex to real operation returns true if the updated 2x2 block is not already diagonal
          if(internal::svd_precondition_2x2_block_to_be_real<MatrixType, QRPreconditioner>::run(m_workMatrix, *this, p, q, maxDiagEntry))
          {
            JacobiRotation<RealScalar> j_left, j_right;
            internal::real_2x2_jacobi_svd(m_workMatrix, p, q, &j_left, &j_right);

            // accumulate resulting Jacobi rotations
            m_workMatrix.applyOnTheLeft(p,q,j_left);
            if(computeU()) m_matrixU.applyOnTheRight(p,q,j_left.transpose());

            m_workMatrix.applyOnTheRight(p,q,j_right);
            if(computeV()) m_matrixV.applyOnTheRight(p,q,j_right);

            // keep track of the largest diagonal coefficient
            maxDiagEntry = numext::maxi<RealScalar>(maxDiagEntry,numext::maxi<RealScalar>(abs(m_workMatrix.coeff(p,p)), abs(m_workMatrix.coeff(q,q))));
          }
        }
      }
    }
  }

  /*** step 3. The work matrix is now diagonal, so ensure it's positive so its diagonal entries are the singular values ***/

  for(Index i = 0; i < m_diagSize; ++i)
  {
    // For a complex matrix, some diagonal coefficients might note have been
    // treated by svd_precondition_2x2_block_to_be_real, and the imaginary part
    // of some diagonal entry might not be null.
    if(NumTraits<Scalar>::IsComplex && abs(numext::imag(m_workMatrix.coeff(i,i)))>considerAsZero)
    {
      RealScalar a = abs(m_workMatrix.coeff(i,i));
      m_singularValues.coeffRef(i) = abs(a);
      if(computeU()) m_matrixU.col(i) *= m_workMatrix.coeff(i,i)/a;
    }
    else
    {
      // m_workMatrix.coeff(i,i) is already real, no difficulty:
      RealScalar a = numext::real(m_workMatrix.coeff(i,i));
      m_singularValues.coeffRef(i) = abs(a);
      if(computeU() && (a<RealScalar(0))) m_matrixU.col(i) = -m_matrixU.col(i);
    }
  }
  
  m_singularValues *= scale;

  /*** step 4. Sort singular values in descending order and compute the number of nonzero singular values ***/

  m_nonzeroSingularValues = m_diagSize;
  for(Index i = 0; i < m_diagSize; i++)
  {
    Index pos;
    RealScalar maxRemainingSingularValue = m_singularValues.tail(m_diagSize-i).maxCoeff(&pos);
    if(maxRemainingSingularValue == RealScalar(0))
    {
      m_nonzeroSingularValues = i;
      break;
    }
    if(pos)
    {
      pos += i;
      std::swap(m_singularValues.coeffRef(i), m_singularValues.coeffRef(pos));
      if(computeU()) m_matrixU.col(pos).swap(m_matrixU.col(i));
      if(computeV()) m_matrixV.col(pos).swap(m_matrixV.col(i));
    }
  }

  m_isInitialized = true;
  return *this;
}